

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O3

bool __thiscall Vector3::operator<(Vector3 *this,Vector3 *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if (rhs->x <= this->x) {
    if (this->x <= rhs->x) {
      if (this->y < rhs->y) {
        return true;
      }
      if (this->y <= rhs->y) {
        return this->z <= rhs->z && rhs->z != this->z;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Vector3::operator<(const Vector3 &rhs) const {
    if (x < rhs.x)
        return true;
    if (rhs.x < x)
        return false;
    if (y < rhs.y)
        return true;
    if (rhs.y < y)
        return false;
    return z < rhs.z;
}